

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

void __thiscall CoreML::ShapeRange::ShapeRange(ShapeRange *this,size_t min,size_t max)

{
  ostream *poVar1;
  runtime_error *this_00;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  size_t local_20;
  size_t max_local;
  size_t min_local;
  ShapeRange *this_local;
  
  local_20 = max;
  max_local = min;
  min_local = (size_t)this;
  RangeValue::RangeValue(&this->_minimum,min);
  RangeValue::RangeValue(&this->_maximum,local_20);
  if (local_20 < max_local) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = std::operator<<(local_198,"Constructing invalid ShapeRange with ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,max_local);
    poVar1 = std::operator<<(poVar1,", ");
    std::ostream::operator<<(poVar1,local_20);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1d8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

ShapeRange::ShapeRange(size_t min, size_t max)
:
_minimum(min),
_maximum(max)
{
    if (min > max) {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange with " << min << ", " << max;
        throw std::runtime_error(ss.str());
    }
}